

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

void makeContextCurrentEGL(_GLFWwindow *window)

{
  EGLBoolean EVar1;
  EGLint EVar2;
  char *pcVar3;
  _GLFWwindow *window_local;
  
  if (window == (_GLFWwindow *)0x0) {
    EVar1 = (*_glfw.egl.MakeCurrent)
                      (_glfw.egl.display,(EGLSurface)0x0,(EGLSurface)0x0,(EGLContext)0x0);
    if (EVar1 == 0) {
      EVar2 = (*_glfw.egl.GetError)();
      pcVar3 = getEGLErrorString(EVar2);
      _glfwInputError(0x10008,"EGL: Failed to clear current context: %s",pcVar3);
      return;
    }
  }
  else {
    EVar1 = (*_glfw.egl.MakeCurrent)
                      (_glfw.egl.display,(window->context).egl.surface,(window->context).egl.surface
                       ,(window->context).egl.handle);
    if (EVar1 == 0) {
      EVar2 = (*_glfw.egl.GetError)();
      pcVar3 = getEGLErrorString(EVar2);
      _glfwInputError(0x10008,"EGL: Failed to make context current: %s",pcVar3);
      return;
    }
  }
  _glfwPlatformSetTls(&_glfw.contextSlot,window);
  return;
}

Assistant:

static void makeContextCurrentEGL(_GLFWwindow* window)
{
    if (window)
    {
        if (!eglMakeCurrent(_glfw.egl.display,
                            window->context.egl.surface,
                            window->context.egl.surface,
                            window->context.egl.handle))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "EGL: Failed to make context current: %s",
                            getEGLErrorString(eglGetError()));
            return;
        }
    }
    else
    {
        if (!eglMakeCurrent(_glfw.egl.display,
                            EGL_NO_SURFACE,
                            EGL_NO_SURFACE,
                            EGL_NO_CONTEXT))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "EGL: Failed to clear current context: %s",
                            getEGLErrorString(eglGetError()));
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}